

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

WebPEncodingError
VP8LEncodeStream(WebPConfig *config,WebPPicture *picture,VP8LBitWriter *bw_main,int use_cache)

{
  int iVar1;
  int iVar2;
  WebPWorkerInterface *pWVar3;
  size_t sVar4;
  size_t sVar5;
  uint32_t in_ECX;
  long lVar6;
  long lVar7;
  VP8LBitWriter *in_RDX;
  long lVar8;
  long lVar9;
  long in_RSI;
  vp8l_atype_t in_RDI;
  int ok_side;
  StreamEncodeContext *param;
  WebPWorker *worker;
  int params_size;
  int ok_main;
  WebPWorkerInterface *worker_interface;
  VP8LBitWriter bw_side;
  WebPAuxStats stats_side;
  StreamEncodeContext params_side;
  StreamEncodeContext params_main;
  WebPWorker worker_side;
  WebPWorker worker_main;
  int red_and_blue_always_zero;
  int idx;
  int num_crunch_configs_side;
  int num_crunch_configs_main;
  CrunchConfig crunch_configs [8];
  VP8LEncoder *enc_side;
  VP8LEncoder *enc_main;
  WebPEncodingError err;
  size_t in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  WebPEncodingError in_stack_fffffffffffffb14;
  WebPConfig *in_stack_fffffffffffffb18;
  WebPConfig *config_00;
  VP8LBitWriter *local_4e0;
  VP8LEncoder *in_stack_fffffffffffffb28;
  VP8LEncoder *enc;
  VP8LBitWriter *in_stack_fffffffffffffb38;
  VP8LEncoder *in_stack_fffffffffffffb40;
  uint8_t local_4a8 [8];
  int *in_stack_fffffffffffffb60;
  int *in_stack_fffffffffffffb68;
  CrunchConfig *in_stack_fffffffffffffb70;
  VP8LEncoder *in_stack_fffffffffffffb78;
  WebPConfig local_474;
  undefined1 local_3b8 [52];
  undefined8 uStack_384;
  undefined4 auStack_37c [50];
  uint32_t local_2b4;
  WebPEncodingError local_2ac;
  undefined1 local_2a0 [52];
  undefined8 uStack_26c;
  undefined4 auStack_264 [50];
  uint32_t local_19c;
  WebPEncodingError local_194;
  undefined1 local_188 [48];
  undefined1 local_158 [296];
  VP8LEncoder *local_30;
  VP8LEncoder *local_28;
  WebPEncodingError local_20;
  uint32_t local_1c;
  VP8LBitWriter *local_18;
  long local_10;
  vp8l_atype_t local_8;
  
  local_20 = VP8_ENC_OK;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_28 = VP8LEncoderNew(in_stack_fffffffffffffb18,
                            (WebPPicture *)
                            CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  local_30 = (VP8LEncoder *)0x0;
  local_158._56_4_ = 0;
  local_158._48_4_ = 0;
  pWVar3 = WebPGetWorkerInterface();
  if ((((local_28 == (VP8LEncoder *)0x0) ||
       (iVar1 = EncoderAnalyze(in_stack_fffffffffffffb78,in_stack_fffffffffffffb70,
                               in_stack_fffffffffffffb68,in_stack_fffffffffffffb60), iVar1 == 0)) ||
      (iVar1 = EncoderInit(in_stack_fffffffffffffb28), iVar1 == 0)) ||
     (iVar1 = VP8LBitWriterInit((VP8LBitWriter *)
                                CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10),
                                in_stack_fffffffffffffb08), iVar1 == 0)) {
    local_20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
  }
  else {
    if (0 < *(int *)(local_8 + 0x54)) {
      local_158._56_4_ = (int)local_158._60_4_ / 2;
      for (local_158._52_4_ = 0; (int)local_158._52_4_ < (int)local_158._56_4_;
          local_158._52_4_ = local_158._52_4_ + 1) {
        lVar6 = (long)(int)local_158._52_4_;
        lVar7 = lVar6 * 0x1c;
        lVar8 = (long)(int)((local_158._60_4_ - local_158._56_4_) + local_158._52_4_);
        lVar9 = lVar8 * 0x1c;
        *(undefined8 *)(local_3b8 + lVar7 + 0x24) = *(undefined8 *)(local_158 + lVar9 + 0x40);
        *(undefined8 *)(local_3b8 + lVar7 + 0x2c) = *(undefined8 *)(local_158 + lVar9 + 0x48);
        *(undefined8 *)((long)&uStack_384 + lVar7) = *(undefined8 *)(local_158 + lVar9 + 0x50);
        auStack_37c[lVar6 * 7] = *(undefined4 *)(local_158 + lVar8 * 0x1c + 0x58);
      }
      local_2b4 = local_158._56_4_;
    }
    local_158._60_4_ = local_158._60_4_ - local_158._56_4_;
    for (local_158._52_4_ = 0; (int)local_158._52_4_ < (int)local_158._60_4_;
        local_158._52_4_ = local_158._52_4_ + 1) {
      lVar6 = (long)(int)local_158._52_4_;
      lVar7 = lVar6 * 0x1c;
      lVar8 = (long)(int)local_158._52_4_;
      lVar9 = lVar8 * 0x1c;
      *(undefined8 *)(local_2a0 + lVar7 + 0x24) = *(undefined8 *)(local_158 + lVar9 + 0x40);
      *(undefined8 *)(local_2a0 + lVar7 + 0x2c) = *(undefined8 *)(local_158 + lVar9 + 0x48);
      *(undefined8 *)((long)&uStack_26c + lVar7) = *(undefined8 *)(local_158 + lVar9 + 0x50);
      auStack_264[lVar6 * 7] = *(undefined4 *)(local_158 + lVar8 * 0x1c + 0x58);
    }
    local_19c = local_158._60_4_;
    iVar1 = 1;
    if (0 < (int)local_158._56_4_) {
      iVar1 = 2;
    }
    for (local_158._52_4_ = 0; (int)local_158._52_4_ < iVar1;
        local_158._52_4_ = local_158._52_4_ + 1) {
      if (local_158._52_4_ == 0) {
        enc = (VP8LEncoder *)(local_188 + 0x30);
        local_4e0 = (VP8LBitWriter *)local_2a0;
      }
      else {
        enc = (VP8LEncoder *)local_188;
        local_4e0 = (VP8LBitWriter *)local_3b8;
      }
      local_4e0->bits_ = local_8;
      *(long *)&local_4e0->used_ = local_10;
      *(uint32_t *)&local_4e0->end_ = local_1c;
      *(undefined4 *)&local_4e0[5].cur_ = local_158._48_4_;
      in_stack_fffffffffffffb40 = enc;
      if (local_158._52_4_ == 0) {
        local_4e0[5].end_ = *(uint8_t **)(local_10 + 0x80);
        local_4e0->buf_ = (uint8_t *)local_18;
        local_4e0->cur_ = (uint8_t *)local_28;
      }
      else {
        if (*(long *)(local_10 + 0x80) == 0) {
          config_00 = (WebPConfig *)0x0;
        }
        else {
          config_00 = &local_474;
        }
        local_4e0[5].end_ = (uint8_t *)config_00;
        iVar2 = VP8LBitWriterClone((VP8LBitWriter *)config_00,
                                   (VP8LBitWriter *)
                                   CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        if (iVar2 == 0) {
          local_20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto LAB_00185555;
        }
        local_4e0->buf_ = local_4a8;
        local_30 = VP8LEncoderNew(config_00,
                                  (WebPPicture *)
                                  CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
        if ((local_30 == (VP8LEncoder *)0x0) || (iVar2 = EncoderInit(enc), iVar2 == 0)) {
          local_20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto LAB_00185555;
        }
        local_30->histo_bits_ = local_28->histo_bits_;
        local_30->transform_bits_ = local_28->transform_bits_;
        local_30->palette_size_ = local_28->palette_size_;
        memcpy(local_30->palette_,local_28->palette_,0x400);
        memcpy(local_30->palette_sorted_,local_28->palette_sorted_,0x400);
        local_4e0->cur_ = (uint8_t *)local_30;
      }
      (*pWVar3->Init)((WebPWorker *)in_stack_fffffffffffffb40);
      *(VP8LBitWriter **)&in_stack_fffffffffffffb40->argb_content_ = local_4e0;
      in_stack_fffffffffffffb40->argb_scratch_ = (uint32_t *)0x0;
      in_stack_fffffffffffffb40->argb_ = (uint32_t *)EncodeStreamHook;
      in_stack_fffffffffffffb38 = local_4e0;
    }
    if (local_158._56_4_ != 0) {
      iVar1 = (*pWVar3->Reset)((WebPWorker *)local_188);
      if (iVar1 == 0) {
        local_20 = VP8_ENC_ERROR_OUT_OF_MEMORY;
        goto LAB_00185555;
      }
      if (*(long *)(local_10 + 0x80) != 0) {
        memcpy(&local_474,*(void **)(local_10 + 0x80),0xbc);
      }
      local_2ac = VP8_ENC_OK;
      (*pWVar3->Launch)((WebPWorker *)local_188);
    }
    (*pWVar3->Execute)((WebPWorker *)(local_188 + 0x30));
    iVar1 = (*pWVar3->Sync)((WebPWorker *)(local_188 + 0x30));
    (*pWVar3->End)((WebPWorker *)(local_188 + 0x30));
    if (local_158._56_4_ == 0) {
      if (iVar1 == 0) {
        local_20 = local_194;
      }
    }
    else {
      iVar2 = (*pWVar3->Sync)((WebPWorker *)local_188);
      (*pWVar3->End)((WebPWorker *)local_188);
      if ((iVar1 == 0) || (iVar2 == 0)) {
        in_stack_fffffffffffffb14 = local_194;
        local_20 = local_194;
        if (iVar1 != 0) {
          in_stack_fffffffffffffb14 = local_2ac;
          local_20 = local_2ac;
        }
      }
      else {
        sVar4 = VP8LBitWriterNumBytes((VP8LBitWriter *)local_4a8);
        sVar5 = VP8LBitWriterNumBytes(local_18);
        if ((sVar4 < sVar5) &&
           (VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffffb40,in_stack_fffffffffffffb38),
           *(long *)(local_10 + 0x80) != 0)) {
          memcpy(*(void **)(local_10 + 0x80),&local_474,0xbc);
        }
      }
    }
  }
LAB_00185555:
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x18555f);
  VP8LEncoderDelete((VP8LEncoder *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  VP8LEncoderDelete((VP8LEncoder *)CONCAT44(in_stack_fffffffffffffb14,in_stack_fffffffffffffb10));
  return local_20;
}

Assistant:

WebPEncodingError VP8LEncodeStream(const WebPConfig* const config,
                                   const WebPPicture* const picture,
                                   VP8LBitWriter* const bw_main,
                                   int use_cache) {
  WebPEncodingError err = VP8_ENC_OK;
  VP8LEncoder* const enc_main = VP8LEncoderNew(config, picture);
  VP8LEncoder* enc_side = NULL;
  CrunchConfig crunch_configs[CRUNCH_CONFIGS_MAX];
  int num_crunch_configs_main, num_crunch_configs_side = 0;
  int idx;
  int red_and_blue_always_zero = 0;
  WebPWorker worker_main, worker_side;
  StreamEncodeContext params_main, params_side;
  // The main thread uses picture->stats, the side thread uses stats_side.
  WebPAuxStats stats_side;
  VP8LBitWriter bw_side;
  const WebPWorkerInterface* const worker_interface = WebPGetWorkerInterface();
  int ok_main;

  // Analyze image (entropy, num_palettes etc)
  if (enc_main == NULL ||
      !EncoderAnalyze(enc_main, crunch_configs, &num_crunch_configs_main,
                      &red_and_blue_always_zero) ||
      !EncoderInit(enc_main) || !VP8LBitWriterInit(&bw_side, 0)) {
    err = VP8_ENC_ERROR_OUT_OF_MEMORY;
    goto Error;
  }

  // Split the configs between the main and side threads (if any).
  if (config->thread_level > 0) {
    num_crunch_configs_side = num_crunch_configs_main / 2;
    for (idx = 0; idx < num_crunch_configs_side; ++idx) {
      params_side.crunch_configs_[idx] =
          crunch_configs[num_crunch_configs_main - num_crunch_configs_side +
                         idx];
    }
    params_side.num_crunch_configs_ = num_crunch_configs_side;
  }
  num_crunch_configs_main -= num_crunch_configs_side;
  for (idx = 0; idx < num_crunch_configs_main; ++idx) {
    params_main.crunch_configs_[idx] = crunch_configs[idx];
  }
  params_main.num_crunch_configs_ = num_crunch_configs_main;

  // Fill in the parameters for the thread workers.
  {
    const int params_size = (num_crunch_configs_side > 0) ? 2 : 1;
    for (idx = 0; idx < params_size; ++idx) {
      // Create the parameters for each worker.
      WebPWorker* const worker = (idx == 0) ? &worker_main : &worker_side;
      StreamEncodeContext* const param =
          (idx == 0) ? &params_main : &params_side;
      param->config_ = config;
      param->picture_ = picture;
      param->use_cache_ = use_cache;
      param->red_and_blue_always_zero_ = red_and_blue_always_zero;
      if (idx == 0) {
        param->stats_ = picture->stats;
        param->bw_ = bw_main;
        param->enc_ = enc_main;
      } else {
        param->stats_ = (picture->stats == NULL) ? NULL : &stats_side;
        // Create a side bit writer.
        if (!VP8LBitWriterClone(bw_main, &bw_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        param->bw_ = &bw_side;
        // Create a side encoder.
        enc_side = VP8LEncoderNew(config, picture);
        if (enc_side == NULL || !EncoderInit(enc_side)) {
          err = VP8_ENC_ERROR_OUT_OF_MEMORY;
          goto Error;
        }
        // Copy the values that were computed for the main encoder.
        enc_side->histo_bits_ = enc_main->histo_bits_;
        enc_side->transform_bits_ = enc_main->transform_bits_;
        enc_side->palette_size_ = enc_main->palette_size_;
        memcpy(enc_side->palette_, enc_main->palette_,
               sizeof(enc_main->palette_));
        memcpy(enc_side->palette_sorted_, enc_main->palette_sorted_,
               sizeof(enc_main->palette_sorted_));
        param->enc_ = enc_side;
      }
      // Create the workers.
      worker_interface->Init(worker);
      worker->data1 = param;
      worker->data2 = NULL;
      worker->hook = EncodeStreamHook;
    }
  }

  // Start the second thread if needed.
  if (num_crunch_configs_side != 0) {
    if (!worker_interface->Reset(&worker_side)) {
      err = VP8_ENC_ERROR_OUT_OF_MEMORY;
      goto Error;
    }
#if !defined(WEBP_DISABLE_STATS)
    // This line is here and not in the param initialization above to remove a
    // Clang static analyzer warning.
    if (picture->stats != NULL) {
      memcpy(&stats_side, picture->stats, sizeof(stats_side));
    }
#endif
    // This line is only useful to remove a Clang static analyzer warning.
    params_side.err_ = VP8_ENC_OK;
    worker_interface->Launch(&worker_side);
  }
  // Execute the main thread.
  worker_interface->Execute(&worker_main);
  ok_main = worker_interface->Sync(&worker_main);
  worker_interface->End(&worker_main);
  if (num_crunch_configs_side != 0) {
    // Wait for the second thread.
    const int ok_side = worker_interface->Sync(&worker_side);
    worker_interface->End(&worker_side);
    if (!ok_main || !ok_side) {
      err = ok_main ? params_side.err_ : params_main.err_;
      goto Error;
    }
    if (VP8LBitWriterNumBytes(&bw_side) < VP8LBitWriterNumBytes(bw_main)) {
      VP8LBitWriterSwap(bw_main, &bw_side);
#if !defined(WEBP_DISABLE_STATS)
      if (picture->stats != NULL) {
        memcpy(picture->stats, &stats_side, sizeof(*picture->stats));
      }
#endif
    }
  } else {
    if (!ok_main) {
      err = params_main.err_;
      goto Error;
    }
  }

Error:
  VP8LBitWriterWipeOut(&bw_side);
  VP8LEncoderDelete(enc_main);
  VP8LEncoderDelete(enc_side);
  return err;
}